

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O3

void __thiscall
ClownLZSS::Internal::BitField::
WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
::Push(WriterBase<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
       *this,bool bit)

{
  uint uVar1;
  anon_class_8_1_8991fb9c local_18;
  
  uVar1 = this->bits_remaining;
  if (uVar1 == 0) {
    local_18.this =
         (DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
          *)this;
    DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)0,(ClownLZSS::Internal::BitField::PushWhere)0,(ClownLZSS::Internal::Endian)0,ClownLZSS::CompressorOutput<std::ofstream>&>
    ::
    Finish<ClownLZSS::Internal::BitField::DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)0,(ClownLZSS::Internal::BitField::PushWhere)0,(ClownLZSS::Internal::Endian)0,ClownLZSS::CompressorOutput<std::ofstream>&>::WriteBitsImplementation()::_lambda()_1_>
              ((DescriptorFieldWriter<2u,(ClownLZSS::Internal::BitField::WriteWhen)0,(ClownLZSS::Internal::BitField::PushWhere)0,(ClownLZSS::Internal::Endian)0,ClownLZSS::CompressorOutput<std::ofstream>&>
                *)this,&local_18);
    DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::Begin((DescriptorFieldWriter<2U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
             *)this);
    uVar1 = this->bits_remaining;
  }
  this->bits = (ulong)bit + this->bits * 2;
  this->bits_remaining = uVar1 - 1;
  return;
}

Assistant:

void Push(const bool bit)
				{
					const auto &CheckWriteBits = [&]()
					{
						if (bits_remaining == 0)
						{
							WriteBits();
						}
					};

					if constexpr(write_when == WriteWhen::BeforePush)
						CheckWriteBits();

					if constexpr(push_where == PushWhere::High)
					{
						bits >>= 1;
						bits |= bit << (total_bits - 1);
					}
					else //if constexpr(push_where == PushWhere::Low)
					{
						bits <<= 1;
						bits |= bit;
					}

					--bits_remaining;

					if constexpr(write_when == WriteWhen::AfterPush)
						CheckWriteBits();
				}